

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

optional<bool> __thiscall
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  ushort uVar5;
  basic_node_ptr<unodb::detail::olc_node_header> bVar6;
  undefined7 in_register_00000011;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar7;
  ushort uVar8;
  optimistic_lock *poVar9;
  db_type *db_instance_00;
  art_key_type k_00;
  find_result fVar10;
  __atomic_base<unsigned_long> local_70;
  write_guard node_guard;
  write_guard local_50;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard child_guard;
  
  k_00.field_0._1_7_ = in_register_00000011;
  k_00.field_0.key_bytes._M_elems[0] = key_byte;
  db_instance_00 = k.field_0._8_8_;
  fVar10 = basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
           ::find_child((basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                         *)this,(byte)inode);
  piVar7 = fVar10.second;
  if (piVar7 == (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                 *)0x0) {
    poVar9 = (optimistic_lock *)
             (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>.
             _M_i;
    if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001ba0a4;
    if ((db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i !=
        *(__int_type_conflict *)&(poVar9->version).version) goto LAB_001b9fa8;
    LOCK();
    paVar1 = &poVar9->read_lock_count;
    lVar2 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_001ba0c3;
    (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
    child_in_parent =
         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> **)
         parent_critical_section;
LAB_001b9f60:
    poVar9 = ((read_critical_section *)child_in_parent)->lock;
    if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_001ba0a4:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    parent_critical_section = (read_critical_section *)child_in_parent;
    if ((((read_critical_section *)child_in_parent)->version).version ==
        (poVar9->version).version.super___atomic_base<unsigned_long>._M_i) {
      LOCK();
      paVar1 = &poVar9->read_lock_count;
      lVar2 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_001ba0c3:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
      ((read_critical_section *)child_in_parent)->lock = (optimistic_lock *)0x0;
      uVar8 = 0x100;
      uVar5 = 0;
      goto LAB_001b9f91;
    }
LAB_001b9fb3:
    optimistic_lock::dec_read_lock_count(poVar9);
    parent_critical_section->lock = (optimistic_lock *)0x0;
  }
  else {
    *(uintptr_t *)child_type = (piVar7->value)._M_i.tagged_ptr;
    bVar4 = optimistic_lock::read_critical_section::check(parent_critical_section);
    if (bVar4) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffff90);
      *child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           local_70._M_i;
      local_70._M_i = 0;
      child_in_parent[1] =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffff90);
      if (*child_in_parent !=
          (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0
         ) {
        uVar3 = *(undefined8 *)child_type;
        *(byte *)&child_critical_section->lock = (byte)uVar3 & 7;
        if ((uVar3 & (I256|I48)) == LEAF) {
          k_00.field_0.key._M_extent._M_extent_value =
               (__extent_storage<18446744073709551615UL>)
               (__extent_storage<18446744073709551615UL>)k.field_0._0_8_;
          bVar4 = basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                  ::matches((basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                             *)(uVar3 & 0xfffffffffffffff8),k_00);
          if (bVar4) {
            if (this[0x20] == (olc_impl_helpers)0x2) {
              node_guard_1.lock =
                   optimistic_lock::write_guard::try_lock_upgrade
                             ((read_critical_section *)db_instance);
              if (node_guard_1.lock != (optimistic_lock *)0x0) {
                child_guard_1.lock =
                     optimistic_lock::write_guard::try_lock_upgrade(parent_critical_section);
                if (child_guard_1.lock != (optimistic_lock *)0x0) {
                  local_50.lock =
                       optimistic_lock::write_guard::try_lock_upgrade
                                 ((read_critical_section *)child_in_parent);
                  if (local_50.lock != (optimistic_lock *)0x0) {
                    local_70._M_i = (__int_type_conflict)db_instance_00;
                    node_guard.lock = (optimistic_lock *)this;
                    optimistic_lock::write_unlock_and_obsolete(child_guard_1.lock);
                    child_guard_1.lock = (optimistic_lock *)0x0;
                    optimistic_lock::write_unlock_and_obsolete(local_50.lock);
                    local_50.lock = (optimistic_lock *)0x0;
                    bVar6 = olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            ::leave_last_child((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                                                *)this,fVar10.first,db_instance_00);
                    node_critical_section->lock = (optimistic_lock *)bVar6.tagged_ptr;
                    if (child_guard_1.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!node_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x62e,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    if (local_50.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!child_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x62f,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    (node_in_parent->value)._M_i.tagged_ptr = 0;
                    std::
                    unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                   *)&stack0xffffffffffffff90);
                    optimistic_lock::write_guard::~write_guard(&local_50);
                    optimistic_lock::write_guard::~write_guard(&child_guard_1);
                    optimistic_lock::write_guard::~write_guard(&node_guard_1);
                    LOCK();
                    (db_instance_00->shrinking_inode_counts)._M_elems[0].
                    super___atomic_base<unsigned_long>._M_i =
                         (db_instance_00->shrinking_inode_counts)._M_elems[0].
                         super___atomic_base<unsigned_long>._M_i + 1;
                    UNLOCK();
                    goto LAB_001b9df6;
                  }
                  optimistic_lock::write_guard::~write_guard(&local_50);
                }
                optimistic_lock::write_guard::~write_guard(&child_guard_1);
              }
              optimistic_lock::write_guard::~write_guard(&node_guard_1);
              goto LAB_001b9fbc;
            }
            poVar9 = (optimistic_lock *)
                     (db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
            if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001ba0a4;
            if ((db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i ==
                *(__int_type_conflict *)&(poVar9->version).version) {
              LOCK();
              paVar1 = &poVar9->read_lock_count;
              lVar2 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_001ba0c3;
              (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>.
              _M_i = 0;
              local_70._M_i =
                   (__int_type_conflict)
                   optimistic_lock::write_guard::try_lock_upgrade(parent_critical_section);
              if ((optimistic_lock *)local_70._M_i == (optimistic_lock *)0x0) {
                uVar8 = 0;
              }
              else {
                node_guard_1.lock =
                     optimistic_lock::write_guard::try_lock_upgrade
                               ((read_critical_section *)child_in_parent);
                if (node_guard_1.lock == (optimistic_lock *)0x0) {
                  uVar8 = 0;
                  node_guard_1.lock = (optimistic_lock *)0x0;
                }
                else {
                  optimistic_lock::write_unlock_and_obsolete(node_guard_1.lock);
                  node_guard_1.lock = (optimistic_lock *)0x0;
                  olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  ::remove((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)this,(char *)(ulong)fVar10.first);
                  (node_in_parent->value)._M_i.tagged_ptr = 0;
                  uVar8 = 0x100;
                }
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffff90);
              goto LAB_001b9ef5;
            }
          }
          else {
            poVar9 = (optimistic_lock *)
                     (db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
            if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001ba0a4;
            if ((db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i ==
                *(__int_type_conflict *)&(poVar9->version).version) {
              LOCK();
              paVar1 = &poVar9->read_lock_count;
              lVar2 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_001ba0c3;
              (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>.
              _M_i = 0;
              poVar9 = parent_critical_section->lock;
              if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001ba0a4;
              if ((parent_critical_section->version).version ==
                  (poVar9->version).version.super___atomic_base<unsigned_long>._M_i) {
                LOCK();
                paVar1 = &poVar9->read_lock_count;
                lVar2 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_001ba0c3;
                parent_critical_section->lock = (optimistic_lock *)0x0;
                goto LAB_001b9f60;
              }
              goto LAB_001b9fb3;
            }
          }
        }
        else {
          (node_in_parent->value)._M_i.tagged_ptr = (uintptr_t)piVar7;
          poVar9 = (optimistic_lock *)
                   (db_instance->root_pointer_lock).version.version.
                   super___atomic_base<unsigned_long>._M_i;
          if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001ba0a4;
          if ((db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i ==
              *(__int_type_conflict *)&(poVar9->version).version) {
            LOCK();
            paVar1 = &poVar9->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_001ba0c3;
            (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i
                 = 0;
LAB_001b9df6:
            uVar8 = 0x100;
LAB_001b9ef5:
            uVar5 = 1;
            goto LAB_001b9f91;
          }
        }
LAB_001b9fa8:
        optimistic_lock::dec_read_lock_count(poVar9);
        (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0
        ;
      }
    }
  }
LAB_001b9fbc:
  uVar5 = 0;
  uVar8 = 0;
LAB_001b9f91:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar8 | uVar5);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}